

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

size_t write_float(MIR_context_t ctx,writer_func_t writer,float fl)

{
  size_t sVar1;
  size_t len;
  float fl_local;
  writer_func_t writer_local;
  MIR_context_t ctx_local;
  
  if (writer == (writer_func_t)0x0) {
    ctx_local = (MIR_context_t)0x0;
  }
  else {
    put_byte(ctx,writer,0x11);
    sVar1 = put_float(ctx,writer,fl);
    ctx_local = (MIR_context_t)(sVar1 + 1);
    ctx->io_ctx->output_float_len = (long)&ctx_local->gen_ctx + ctx->io_ctx->output_float_len;
  }
  return (size_t)ctx_local;
}

Assistant:

static size_t write_float (MIR_context_t ctx, writer_func_t writer, float fl) {
  size_t len;

  if (writer == NULL) return 0;
  put_byte (ctx, writer, TAG_F);
  len = put_float (ctx, writer, fl) + 1;
  output_float_len += len;
  return len;
}